

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O2

Gia_Man_t * Gia_SweeperStart(Gia_Man_t *pGia)

{
  int iVar1;
  Swp_Man_t *p;
  Vec_Int_t *pVVar2;
  sat_solver *s;
  abctime aVar3;
  lit local_24;
  
  if (pGia == (Gia_Man_t *)0x0) {
    pGia = Gia_ManStart(10000);
  }
  if (pGia->pHTable == (int *)0x0) {
    Gia_ManHashStart(pGia);
    if (pGia->pHTable == (int *)0x0) {
      __assert_fail("pGia->pHTable != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweeper.c"
                    ,0x6f,"Swp_Man_t *Swp_ManStart(Gia_Man_t *)");
    }
  }
  p = (Swp_Man_t *)calloc(1,0xa8);
  pGia->pData = p;
  p->pGia = pGia;
  p->nConfMax = 1000;
  pVVar2 = Vec_IntAlloc(100);
  p->vProbes = pVVar2;
  pVVar2 = Vec_IntAlloc(100);
  p->vCondProbes = pVVar2;
  pVVar2 = Vec_IntAlloc(100);
  p->vCondAssump = pVVar2;
  pVVar2 = Vec_IntAlloc(10000);
  p->vId2Lit = pVVar2;
  pVVar2 = Vec_IntAlloc(100);
  p->vFront = pVVar2;
  pVVar2 = Vec_IntAlloc(100);
  p->vFanins = pVVar2;
  pVVar2 = Vec_IntAlloc(100);
  p->vCexSwp = pVVar2;
  s = sat_solver_new();
  p->pSat = s;
  p->nSatVars = 1;
  sat_solver_setnvars(s,1000);
  iVar1 = p->nSatVars;
  p->nSatVars = iVar1 + 1;
  iVar1 = Abc_Var2Lit(iVar1,0);
  Swp_ManSetObj2Lit(p,0,iVar1);
  Abc_LitNot(iVar1);
  sat_solver_addclause(p->pSat,&local_24,(lit *)&stack0xffffffffffffffe0);
  aVar3 = Abc_Clock();
  p->timeStart = aVar3;
  pGia->fSweeper = 1;
  return pGia;
}

Assistant:

Gia_Man_t * Gia_SweeperStart( Gia_Man_t * pGia )
{
    if ( pGia == NULL )
        pGia = Gia_ManStart( 10000 );
    if ( pGia->pHTable == NULL )
        Gia_ManHashStart( pGia );
    // recompute fPhase and fMark1 to mark multiple fanout nodes if AIG is already defined!!!

    Swp_ManStart( pGia );
    pGia->fSweeper = 1;
    return pGia;
}